

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

void ts_subtree__print_dot_graph
               (Subtree *self,uint32_t start_offset,TSLanguage *language,TSSymbol alias_symbol,
               FILE *f)

{
  Subtree *self_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Subtree *pSVar6;
  TSSymbol alias_symbol_00;
  ushort uVar7;
  TSSymbol *pTVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  SubtreeHeapData *pSVar11;
  uint32_t i;
  ulong uVar12;
  char *c;
  char *pcVar13;
  long lVar14;
  uint32_t local_b4;
  Length result;
  Length result_1;
  
  pSVar11 = self->ptr;
  if (((ulong)pSVar11 & 1) == 0) {
    uVar7 = pSVar11->symbol;
    uVar2 = (pSVar11->padding).bytes;
    uVar3 = (pSVar11->size).bytes;
  }
  else {
    uVar7 = (ushort)((ulong)pSVar11 >> 8) & 0xff;
    uVar2 = (uint)((ulong)pSVar11 >> 0x10) & 0xff;
    uVar3 = (uint)((ulong)pSVar11 >> 0x18) & 0xff;
  }
  if (alias_symbol == 0) {
    alias_symbol = uVar7;
  }
  fprintf((FILE *)f,"tree_%p [label=\"",self);
  if (alias_symbol == 0xffff) {
    pcVar13 = "ERROR";
  }
  else if (alias_symbol == 0xfffe) {
    pcVar13 = "_ERROR";
  }
  else {
    pcVar13 = language->symbol_names[alias_symbol];
  }
  do {
    cVar1 = *pcVar13;
    if (cVar1 == '\n') {
      __s = "\\n";
LAB_001347f3:
      fputs(__s,(FILE *)f);
    }
    else {
      if (cVar1 == '\"') {
        __s = "\\\"";
        goto LAB_001347f3;
      }
      if (cVar1 == '\0') {
        fputc(0x22,(FILE *)f);
        pSVar11 = self->ptr;
        if ((((ulong)pSVar11 & 1) != 0) || (pSVar11->child_count == 0)) {
          fwrite(", shape=plaintext",0x11,1,(FILE *)f);
          pSVar11 = self->ptr;
        }
        if (((ulong)pSVar11 & 1) == 0) {
          uVar4 = *(uint *)&pSVar11->field_0x2c >> 2;
        }
        else {
          uVar4 = (uint)((ulong)pSVar11 >> 3) & 0x1fffffff;
        }
        if ((uVar4 & 1) != 0) {
          fwrite(", fontcolor=gray",0x10,1,(FILE *)f);
          pSVar11 = self->ptr;
        }
        if (((ulong)pSVar11 & 1) == 0) {
          uVar10 = 0x262;
          if (-1 < (char)*(ushort *)&pSVar11->field_0x2c) {
            uVar10 = (ulong)pSVar11->error_cost;
          }
          uVar4 = (uint)(*(ushort *)&pSVar11->field_0x2c >> 5);
          if (pSVar11->child_count == 0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)(pSVar11->field_17).field_0.repeat_depth;
          }
          uVar9 = (ulong)pSVar11->parse_state;
          uVar5 = pSVar11->lookahead_bytes;
        }
        else {
          uVar9 = (ulong)pSVar11 >> 0x30;
          uVar12 = 0;
          uVar10 = 0x262;
          if (((ulong)pSVar11 & 0x20) == 0) {
            uVar10 = uVar12;
          }
          uVar4 = (uint)((ulong)pSVar11 >> 4);
          uVar5 = (uint)((ulong)pSVar11 >> 0x2c) & 0xf;
        }
        fprintf((FILE *)f,
                ", tooltip=\"range: %u - %u\nstate: %d\nerror-cost: %u\nhas-changes: %u\nrepeat-depth: %u\nlookahead-bytes: %u\"]\n"
                ,(ulong)start_offset,(ulong)(uVar2 + uVar3 + start_offset),uVar9,uVar10,
                (ulong)(uVar4 & 1),uVar12,(ulong)uVar5);
        pSVar11 = self->ptr;
        if ((((ulong)pSVar11 & 1) == 0) && (uVar2 = pSVar11->child_count, (ulong)uVar2 != 0)) {
          uVar10 = (ulong)(pSVar11->field_17).field_0.alias_sequence_id;
          if (uVar10 == 0) {
            pTVar8 = (TSSymbol *)0x0;
          }
          else {
            pTVar8 = language->alias_sequences + language->max_alias_sequence_length * uVar10;
          }
          lVar14 = 0;
          uVar12 = 0;
          uVar10 = 0;
          local_b4 = start_offset;
          do {
            pSVar6 = (self->ptr->field_17).field_0.children;
            pSVar11 = pSVar6[uVar12].ptr;
            if (((ulong)pSVar11 & 1) == 0) {
              uVar3 = *(uint *)&pSVar11->field_0x2c >> 2;
            }
            else {
              uVar3 = (uint)((ulong)pSVar11 >> 3) & 0x1fffffff;
            }
            self_00 = (Subtree *)((long)pSVar6 + lVar14);
            if ((uVar3 & 1) == 0) {
              if (pTVar8 == (TSSymbol *)0x0) {
                alias_symbol_00 = 0;
              }
              else {
                alias_symbol_00 = pTVar8[uVar10];
              }
              ts_subtree__print_dot_graph(self_00,local_b4,language,alias_symbol_00,f);
              uVar10 = (ulong)((int)uVar10 + 1);
            }
            else {
              ts_subtree__print_dot_graph(self_00,local_b4,language,0,f);
            }
            fprintf((FILE *)f,"tree_%p -> tree_%p [tooltip=%u]\n",self,self_00,uVar12 & 0xffffffff);
            pSVar11 = pSVar6[uVar12].ptr;
            if (((ulong)pSVar11 & 1) == 0) {
              uVar4 = (pSVar11->padding).bytes;
              uVar5 = (pSVar11->size).bytes;
            }
            else {
              uVar4 = (uint)((ulong)pSVar11 >> 0x10) & 0xff;
              uVar5 = (uint)((ulong)pSVar11 >> 0x18) & 0xff;
            }
            local_b4 = local_b4 + uVar4 + uVar5;
            uVar12 = uVar12 + 1;
            lVar14 = lVar14 + 8;
          } while (uVar2 != uVar12);
        }
        return;
      }
      fputc((int)cVar1,(FILE *)f);
    }
    pcVar13 = pcVar13 + 1;
  } while( true );
}

Assistant:

void ts_subtree__print_dot_graph(const Subtree *self, uint32_t start_offset,
                                 const TSLanguage *language, TSSymbol alias_symbol,
                                 FILE *f) {
  TSSymbol subtree_symbol = ts_subtree_symbol(*self);
  TSSymbol symbol = alias_symbol ? alias_symbol : subtree_symbol;
  uint32_t end_offset = start_offset + ts_subtree_total_bytes(*self);
  fprintf(f, "tree_%p [label=\"", self);
  ts_subtree__write_dot_string(f, ts_language_symbol_name(language, symbol));
  fprintf(f, "\"");

  if (ts_subtree_child_count(*self) == 0) fprintf(f, ", shape=plaintext");
  if (ts_subtree_extra(*self)) fprintf(f, ", fontcolor=gray");

  fprintf(f, ", tooltip=\""
    "range: %u - %u\n"
    "state: %d\n"
    "error-cost: %u\n"
    "has-changes: %u\n"
    "repeat-depth: %u\n"
    "lookahead-bytes: %u\"]\n",
    start_offset, end_offset,
    ts_subtree_parse_state(*self),
    ts_subtree_error_cost(*self),
    ts_subtree_has_changes(*self),
    ts_subtree_repeat_depth(*self),
    ts_subtree_lookahead_bytes(*self)
  );

  uint32_t child_start_offset = start_offset;
  uint32_t structural_child_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    language,
    ts_subtree_alias_sequence_id(*self)
  );
  for (uint32_t i = 0, n = ts_subtree_child_count(*self); i < n; i++) {
    const Subtree *child = &self->ptr->children[i];
    if (ts_subtree_extra(*child)) {
      ts_subtree__print_dot_graph(child, child_start_offset, language, 0, f);
    } else {
      TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
      ts_subtree__print_dot_graph(child, child_start_offset, language, alias_symbol, f);
      structural_child_index++;
    }
    fprintf(f, "tree_%p -> tree_%p [tooltip=%u]\n", self, child, i);
    child_start_offset += ts_subtree_total_bytes(*child);
  }
}